

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

SpectrumConstantTexture *
pbrt::SpectrumConstantTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uintptr_t iptr;
  SpectrumHandle c;
  undefined1 local_58 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
  *local_50;
  long local_40 [2];
  ulong local_30;
  
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
  *(undefined4 *)CONCAT44(extraout_var,iVar1) = 0x3f800000;
  local_50 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
              *)local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"value","");
  local_30 = CONCAT44(extraout_var,iVar1) | 0x1000000000000;
  TextureParameterDictionary::GetOneSpectrum
            ((TextureParameterDictionary *)local_58,(string *)parameters,(SpectrumHandle *)&local_50
             ,(SpectrumType)&local_30,(Allocator)0x0);
  if (local_50 !=
      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
       *)local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,8,8);
  (((SpectrumConstantTexture *)CONCAT44(extraout_var_00,iVar1))->value).
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (uintptr_t)local_58;
  return (SpectrumConstantTexture *)CONCAT44(extraout_var_00,iVar1);
}

Assistant:

SpectrumConstantTexture *SpectrumConstantTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    const FileLoc *loc, Allocator alloc) {
    SpectrumHandle one = alloc.new_object<ConstantSpectrum>(1.);
    SpectrumHandle c =
        parameters.GetOneSpectrum("value", one, SpectrumType::Reflectance, alloc);
    return alloc.new_object<SpectrumConstantTexture>(c);
}